

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O0

int KINGetLinWorkSpace(void *kinmem,long *lenrwLS,long *leniwLS)

{
  int iVar1;
  long *in_RDX;
  long *in_RSI;
  int retval;
  long liw;
  long lrw;
  sunindextype liw1;
  sunindextype lrw1;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long *local_20;
  long *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_4 = kinLs_AccessLMem(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                             (KINMem *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                             ,(KINLsMem *)0x115c5e);
  if (local_4 == 0) {
    *local_18 = 1;
    *local_20 = 0x15;
    if (*(long *)(*(long *)(*(long *)(local_28 + 0x148) + 8) + 0x20) != 0) {
      N_VSpace(*(undefined8 *)(local_28 + 0x148),&local_38,&local_40);
      *local_18 = local_38 + *local_18;
      *local_20 = local_40 + *local_20;
    }
    if ((*(long *)(*(long *)(*(long *)(local_30 + 0x20) + 8) + 0x60) != 0) &&
       (iVar1 = SUNLinSolSpace(*(undefined8 *)(local_30 + 0x20),&stack0xffffffffffffffb8,
                               &stack0xffffffffffffffb0), iVar1 == 0)) {
      *local_18 = (long)in_stack_ffffffffffffffb8 + *local_18;
      *local_20 = (long)(in_stack_ffffffffffffffb0 + *local_20);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int KINGetLinWorkSpace(void* kinmem, long int* lenrwLS, long int* leniwLS)
{
  KINMem kin_mem;
  KINLsMem kinls_mem;
  sunindextype lrw1, liw1;
  long int lrw, liw;
  int retval;

  /* access KINLsMem structure */
  retval = kinLs_AccessLMem(kinmem, __func__, &kin_mem, &kinls_mem);
  if (retval != KIN_SUCCESS) { return (retval); }

  /* start with fixed sizes plus vector/matrix pointers */
  *lenrwLS = 1;
  *leniwLS = 21;

  /* add N_Vector sizes */
  if (kin_mem->kin_vtemp1->ops->nvspace)
  {
    N_VSpace(kin_mem->kin_vtemp1, &lrw1, &liw1);
    *lenrwLS += lrw1;
    *leniwLS += liw1;
  }

  /* add LS sizes */
  if (kinls_mem->LS->ops->space)
  {
    retval = SUNLinSolSpace(kinls_mem->LS, &lrw, &liw);
    if (retval == 0)
    {
      *lenrwLS += lrw;
      *leniwLS += liw;
    }
  }

  return (KINLS_SUCCESS);
}